

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockExpectedCall_callOrderIsFulfilledButWithWrongOrderMultipleTooLate_TestShell::createTest
          (TEST_MockExpectedCall_callOrderIsFulfilledButWithWrongOrderMultipleTooLate_TestShell
           *this)

{
  TEST_MockExpectedCall_callOrderIsFulfilledButWithWrongOrderMultipleTooLate_Test *this_00;
  
  this_00 = (TEST_MockExpectedCall_callOrderIsFulfilledButWithWrongOrderMultipleTooLate_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                         ,0x2a8);
  TEST_MockExpectedCall_callOrderIsFulfilledButWithWrongOrderMultipleTooLate_Test::
  TEST_MockExpectedCall_callOrderIsFulfilledButWithWrongOrderMultipleTooLate_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCall, callOrderIsFulfilledButWithWrongOrderMultipleTooLate)
{
    MockCheckedExpectedCall expectedCall(3);
    expectedCall.withName("name");
    expectedCall.withCallOrder(10, 12);
    expectedCall.callWasMade(11);
    expectedCall.callWasMade(12);
    expectedCall.callWasMade(13);
    CHECK(expectedCall.isFulfilled());
    CHECK(expectedCall.isOutOfOrder());
}